

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register.cpp
# Opt level: O2

void __thiscall CRegister::RegisterGotCount(CRegister *this,CNetChunk *pChunk)

{
  ushort uVar1;
  NETADDR *pNVar2;
  int iVar3;
  NETADDR *a;
  long lVar4;
  
  uVar1 = *(ushort *)((long)pChunk->m_pData + 8);
  lVar4 = 5;
  pNVar2 = &this->m_aMasterserverInfo[0].m_Addr;
  do {
    a = pNVar2;
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      return;
    }
    iVar3 = net_addr_comp(a,&pChunk->m_Address,1);
    pNVar2 = (NETADDR *)(a[1].ip + 0xc);
  } while (iVar3 != 0);
  a[1].type = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
  return;
}

Assistant:

void CRegister::RegisterGotCount(CNetChunk *pChunk)
{
	unsigned char *pData = (unsigned char *)pChunk->m_pData;
	int Count = (pData[sizeof(SERVERBROWSE_COUNT)]<<8) | pData[sizeof(SERVERBROWSE_COUNT)+1];

	for(int i = 0; i < IMasterServer::MAX_MASTERSERVERS; i++)
	{
		if(net_addr_comp(&m_aMasterserverInfo[i].m_Addr, &pChunk->m_Address, true) == 0)
		{
			m_aMasterserverInfo[i].m_Count = Count;
			break;
		}
	}
}